

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cc
# Opt level: O3

ostream * pstack::operator<<(ostream *os,JSON<Elf64_Rela,_char> *rela)

{
  ostream *poVar1;
  JObject *pJVar2;
  ulong local_40;
  ulong local_38;
  JObject local_30;
  char local_1b [3];
  
  local_30.sep = "";
  local_30.os = os;
  std::__ostream_insert<char,std::char_traits<char>>(os,"{ ",2);
  local_1b[0] = '\0';
  pJVar2 = JObject::field<char[9],unsigned_long,char>
                     (&local_30,(char (*) [9])"r_offset",&rela->object->r_offset,local_1b);
  local_40 = (ulong)*(uint *)((long)&rela->object->r_info + 4);
  local_1b[1] = 0;
  pJVar2 = JObject::field<char[11],unsigned_long,char>
                     (pJVar2,(char (*) [11])"r_info-sym",&local_40,local_1b + 1);
  local_38 = (ulong)(uint)rela->object->r_info;
  local_1b[2] = 0;
  pJVar2 = JObject::field<char[12],unsigned_long,char>
                     (pJVar2,(char (*) [12])"r_info-type",&local_38,local_1b + 2);
  poVar1 = pJVar2->os;
  JObject::~JObject(&local_30);
  return poVar1;
}

Assistant:

std::ostream &
operator <<(std::ostream &os, const JSON<Elf::Rela> &rela)
{
   return JObject(os)
      .field("r_offset", rela.object.r_offset)
      .field("r_info-sym", ELF_R_SYM(rela.object.r_info))
      .field("r_info-type", ELF_R_TYPE(rela.object.r_info));
}